

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O0

void phmap::priv::
     BucketCountAllocTest<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>>
               (void)

{
  _Head_base<0UL,_unsigned_long,_false> *this;
  bool bVar1;
  char *pcVar2;
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  *s;
  char *in_R9;
  AssertHelper local_588;
  Message local_580;
  int local_574;
  size_t local_570;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_2;
  Message local_550;
  vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
  local_548;
  char local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4f8;
  Message local_4f0;
  bool local_4e1;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_;
  Message local_4c8;
  undefined1 local_4c0 [8];
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_498 [8];
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  m;
  A alloc;
  
  this = (_Head_base<0UL,_unsigned_long,_false> *)
         ((long)&m.
                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                 .sets_._M_elems[0xf].set_.settings_.
                 super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
         + 0x18);
  Alloc<phmap::priv::hash_internal::Enum>::Alloc((Alloc<phmap::priv::hash_internal::Enum> *)this,0);
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  ::parallel_hash_set((parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
                       *)local_498,0x7b,(allocator_type *)this);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
  ::get_allocator((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                   *)local_4c0);
  testing::internal::EqHelper::
  Compare<phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_nullptr>
            ((EqHelper *)local_4b8,"m.get_allocator()","alloc",
             (Alloc<phmap::priv::hash_internal::Enum> *)local_4c0,
             (Alloc<phmap::priv::hash_internal::Enum> *)
             ((long)&m.
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                     .sets_._M_elems[0xf].set_.settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
             + 0x18));
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)local_4c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  local_4e1 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              ::empty((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                       *)local_498);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4e0,&local_4e1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_4e0,(AssertionResult *)0x2a1e80,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  testing::UnorderedElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>();
  keys<phmap::parallel_flat_hash_set<phmap::priv::hash_internal::Enum,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,4ul,phmap::NullMutex>>
            (&local_548,(priv *)local_498,s);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<>>>::
  operator()(local_528,&local_529,
             (vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>
              *)"keys(m)");
  std::vector<phmap::priv::hash_internal::Enum,_std::allocator<phmap::priv::hash_internal::Enum>_>::
  ~vector(&local_548);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
  local_570 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
              ::bucket_count((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                              *)local_498);
  local_574 = 0x7b;
  testing::internal::CmpHelperGE<unsigned_long,int>
            ((internal *)local_568,"m.bucket_count()","123",&local_570,&local_574);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_580);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_588,&local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_set
            ((parallel_flat_hash_set<phmap::priv::hash_internal::Enum,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>,_4UL,_phmap::NullMutex>
              *)local_498);
  Alloc<phmap::priv::hash_internal::Enum>::~Alloc
            ((Alloc<phmap::priv::hash_internal::Enum> *)
             ((long)&m.
                     super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::Enum>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
                     .sets_._M_elems[0xf].set_.settings_.
                     super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::Enum>_>
             + 0x18));
  return;
}

Assistant:

void BucketCountAllocTest(std::true_type) {
  using A = typename TypeParam::allocator_type;
  A alloc(0);
  TypeParam m(123, alloc);
  EXPECT_EQ(m.get_allocator(), alloc);
  EXPECT_TRUE(m.empty());
  EXPECT_THAT(keys(m), ::testing::UnorderedElementsAre());
  EXPECT_GE(m.bucket_count(), 123);
}